

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSetIterator::nextRange(UnicodeSetIterator *this)

{
  UVector *this_00;
  int iVar1;
  UnicodeString *pUVar2;
  int iVar3;
  
  this->string = (UnicodeString *)0x0;
  iVar1 = this->endElement;
  iVar3 = this->nextElement;
  if (iVar1 < iVar3) {
    if (this->endRange <= this->range) {
      iVar1 = this->nextString;
      if (iVar1 < this->stringCount) {
        this->codepoint = -1;
        this_00 = this->set->strings;
        this->nextString = iVar1 + 1;
        pUVar2 = (UnicodeString *)UVector::elementAt(this_00,iVar1);
        this->string = pUVar2;
        return '\x01';
      }
      return '\0';
    }
    this->range = this->range + 1;
    (*(this->super_UObject)._vptr_UObject[3])(this);
    iVar1 = this->endElement;
    iVar3 = this->nextElement;
  }
  this->codepointEnd = iVar1;
  this->codepoint = iVar3;
  this->nextElement = iVar1 + 1;
  return '\x01';
}

Assistant:

UBool UnicodeSetIterator::nextRange() {
    string = NULL;
    if (nextElement <= endElement) {
        codepointEnd = endElement;
        codepoint = nextElement;
        nextElement = endElement+1;
        return TRUE;
    }
    if (range < endRange) {
        loadRange(++range);
        codepointEnd = endElement;
        codepoint = nextElement;
        nextElement = endElement+1;
        return TRUE;
    }

    if (nextString >= stringCount) return FALSE;
    codepoint = (UChar32)IS_STRING; // signal that value is actually a string
    string = (const UnicodeString*) set->strings->elementAt(nextString++);
    return TRUE;
}